

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O3

void kratos::hash_generator_src(Context *context,Generator *generator)

{
  size_type *psVar1;
  uint64_t hash;
  undefined8 in_R9;
  long local_278;
  ifstream fs;
  undefined8 auStack_190 [36];
  undefined1 local_70 [8];
  string filename;
  size_type *local_40;
  string content;
  
  Generator::external_filename_abi_cxx11_((string *)local_70,generator);
  std::ifstream::ifstream(&local_278,(string *)local_70,_S_in);
  psVar1 = &content._M_string_length;
  local_40 = psVar1;
  content._M_dataplus._M_p = (pointer)0x0;
  content._M_string_length._0_1_ = 0;
  filename.field_2._8_8_ = 0;
  std::__cxx11::string::_M_replace_dispatch<std::istreambuf_iterator<char,std::char_traits<char>>>
            ((string *)&local_40,psVar1,psVar1,
             *(undefined8 *)((long)auStack_190 + *(long *)(local_278 + -0x18)),0xffffffff,in_R9,0,
             0xffffffff);
  hash = XXHash64::hash(local_40,(uint64_t)content._M_dataplus._M_p,0);
  Context::add_hash(context,generator,hash);
  if (local_40 != psVar1) {
    operator_delete(local_40,CONCAT71(content._M_string_length._1_7_,
                                      (undefined1)content._M_string_length) + 1);
  }
  std::ifstream::~ifstream(&local_278);
  if (local_70 != (undefined1  [8])&filename._M_string_length) {
    operator_delete((void *)local_70,filename._M_string_length + 1);
  }
  return;
}

Assistant:

void hash_generator_src(Context* context, Generator* generator) {
    auto filename = generator->external_filename();
    std::ifstream fs(filename);

    std::string content;
    content.assign(std::istreambuf_iterator<char>(fs), std::istreambuf_iterator<char>());
    uint64_t hash = XXHash64::hash(content.c_str(), content.size(), 0);
    context->add_hash(generator, hash);
}